

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O2

void av1_dr_prediction_z1_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  undefined1 (*pauVar11) [16];
  int iVar12;
  ushort uVar13;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar23;
  undefined1 auVar16 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ushort uVar35;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  undefined1 in_XMM9 [16];
  undefined1 auVar36 [16];
  ushort uVar43;
  undefined1 in_XMM10 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined8 local_438 [129];
  
  uVar2 = (ulong)(uint)bh;
  if (bw == 0x40) {
    dr_prediction_z1_64xN_sse4_1(bh,dst,stride,above,dx,(int)left);
    return;
  }
  bVar4 = (byte)upsample_above;
  if (bw == 8) {
    iVar12 = bh + 7 << (bVar4 & 0x1f);
    auVar24 = pshufb(ZEXT116(above[iVar12]),(undefined1  [16])0x0);
    uVar6 = 0;
    uVar5 = 0;
    if (0 < bh) {
      uVar5 = uVar2;
    }
    pauVar11 = (undefined1 (*) [16])local_438;
    auVar25 = pmovsxbw(in_XMM3,0x1010101010101010);
    auVar26 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
    uVar9 = dx;
    while( true ) {
      if (uVar5 == uVar6) goto LAB_002e431a;
      iVar10 = (int)uVar9 >> (6 - bVar4 & 0x1f);
      uVar7 = iVar12 - iVar10 >> (bVar4 & 0x1f);
      if ((int)uVar7 < 1) break;
      if (7 < uVar7) {
        uVar7 = 8;
      }
      auVar14 = *(undefined1 (*) [16])(above + iVar10);
      if (upsample_above == 0) {
        auVar27 = *(undefined1 (*) [16])(above + (long)iVar10 + 1);
        auVar28 = ZEXT416(uVar9 >> 1 & 0x1f);
        auVar28 = pshuflw(auVar28,auVar28,0);
        auVar28._4_4_ = auVar28._0_4_;
        auVar28._8_4_ = auVar28._0_4_;
        auVar28._12_4_ = auVar28._0_4_;
      }
      else {
        auVar14 = pshufb(auVar14,_DAT_00468b70);
        auVar27 = auVar14 >> 0x40;
        auVar28 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
        auVar36._0_4_ = auVar28._0_4_;
        auVar36._4_4_ = auVar36._0_4_;
        auVar36._8_4_ = auVar36._0_4_;
        auVar36._12_4_ = auVar36._0_4_;
        auVar28 = psllw(auVar36,ZEXT416((uint)upsample_above));
        auVar44._0_2_ = auVar28._0_2_ >> 1;
        auVar44._2_2_ = auVar28._2_2_ >> 1;
        auVar44._4_2_ = auVar28._4_2_ >> 1;
        auVar44._6_2_ = auVar28._6_2_ >> 1;
        auVar44._8_2_ = auVar28._8_2_ >> 1;
        auVar44._10_2_ = auVar28._10_2_ >> 1;
        auVar44._12_2_ = auVar28._12_2_ >> 1;
        auVar44._14_2_ = auVar28._14_2_ >> 1;
        auVar28 = auVar44 & auVar26;
      }
      auVar36 = pmovzxbw(in_XMM9,auVar14);
      auVar45 = pmovzxbw(in_XMM10,auVar27);
      auVar44 = psllw(auVar36,5);
      in_XMM10._0_2_ = (auVar45._0_2_ - auVar36._0_2_) * auVar28._0_2_;
      in_XMM10._2_2_ = (auVar45._2_2_ - auVar36._2_2_) * auVar28._2_2_;
      in_XMM10._4_2_ = (auVar45._4_2_ - auVar36._4_2_) * auVar28._4_2_;
      in_XMM10._6_2_ = (auVar45._6_2_ - auVar36._6_2_) * auVar28._6_2_;
      in_XMM10._8_2_ = (auVar45._8_2_ - auVar36._8_2_) * auVar28._8_2_;
      in_XMM10._10_2_ = (auVar45._10_2_ - auVar36._10_2_) * auVar28._10_2_;
      in_XMM10._12_2_ = (auVar45._12_2_ - auVar36._12_2_) * auVar28._12_2_;
      in_XMM10._14_2_ = (auVar45._14_2_ - auVar36._14_2_) * auVar28._14_2_;
      uVar35 = (ushort)(auVar44._0_2_ + auVar25._0_2_ + in_XMM10._0_2_) >> 5;
      uVar37 = (ushort)(auVar44._2_2_ + auVar25._2_2_ + in_XMM10._2_2_) >> 5;
      uVar38 = (ushort)(auVar44._4_2_ + auVar25._4_2_ + in_XMM10._4_2_) >> 5;
      uVar39 = (ushort)(auVar44._6_2_ + auVar25._6_2_ + in_XMM10._6_2_) >> 5;
      uVar40 = (ushort)(auVar44._8_2_ + auVar25._8_2_ + in_XMM10._8_2_) >> 5;
      uVar41 = (ushort)(auVar44._10_2_ + auVar25._10_2_ + in_XMM10._10_2_) >> 5;
      uVar42 = (ushort)(auVar44._12_2_ + auVar25._12_2_ + in_XMM10._12_2_) >> 5;
      uVar43 = (ushort)(auVar44._14_2_ + auVar25._14_2_ + in_XMM10._14_2_) >> 5;
      auVar45._0_2_ = CONCAT11(0,auVar14[8]);
      auVar45[2] = auVar14[9];
      auVar45[3] = 0;
      auVar45[4] = auVar14[10];
      auVar45[5] = 0;
      auVar45[6] = auVar14[0xb];
      auVar45[7] = 0;
      auVar45[8] = auVar14[0xc];
      auVar45[9] = 0;
      auVar45[10] = auVar14[0xd];
      auVar45[0xb] = 0;
      auVar45[0xc] = auVar14[0xe];
      auVar45[0xd] = 0;
      auVar45[0xe] = auVar14[0xf];
      auVar45[0xf] = 0;
      auVar36 = psllw(auVar45,5);
      uVar13 = (ushort)(auVar36._0_2_ + auVar25._0_2_ + (auVar27[8] - auVar45._0_2_) * auVar28._0_2_
                       ) >> 5;
      uVar17 = (ushort)(auVar36._2_2_ + auVar25._2_2_ +
                       ((ushort)auVar27[9] - (ushort)auVar14[9]) * auVar28._2_2_) >> 5;
      uVar18 = (ushort)(auVar36._4_2_ + auVar25._4_2_ +
                       ((ushort)auVar27[10] - (ushort)auVar14[10]) * auVar28._4_2_) >> 5;
      uVar19 = (ushort)(auVar36._6_2_ + auVar25._6_2_ +
                       ((ushort)auVar27[0xb] - (ushort)auVar14[0xb]) * auVar28._6_2_) >> 5;
      uVar20 = (ushort)(auVar36._8_2_ + auVar25._8_2_ +
                       ((ushort)auVar27[0xc] - (ushort)auVar14[0xc]) * auVar28._8_2_) >> 5;
      uVar21 = (ushort)(auVar36._10_2_ + auVar25._10_2_ +
                       ((ushort)auVar27[0xd] - (ushort)auVar14[0xd]) * auVar28._10_2_) >> 5;
      uVar22 = (ushort)(auVar36._12_2_ + auVar25._12_2_ +
                       ((ushort)auVar27[0xe] - (ushort)auVar14[0xe]) * auVar28._12_2_) >> 5;
      uVar23 = (ushort)(auVar36._14_2_ + auVar25._14_2_ +
                       ((ushort)auVar27[0xf] - (ushort)auVar14[0xf]) * auVar28._14_2_) >> 5;
      in_XMM9[1] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
      in_XMM9[0] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
      in_XMM9[2] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
      in_XMM9[3] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
      in_XMM9[4] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
      in_XMM9[5] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
      in_XMM9[6] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
      in_XMM9[7] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
      in_XMM9[8] = (uVar13 != 0) * (uVar13 < 0x100) * (char)uVar13 - (0xff < uVar13);
      in_XMM9[9] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
      in_XMM9[10] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
      in_XMM9[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
      in_XMM9[0xc] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
      in_XMM9[0xd] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
      in_XMM9[0xe] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
      in_XMM9[0xf] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
      auVar14 = pblendvb(auVar24,in_XMM9,(undefined1  [16])Mask[0][uVar7]);
      *pauVar11 = auVar14;
      uVar9 = uVar9 + dx;
      uVar6 = uVar6 + 1;
      pauVar11 = pauVar11 + 1;
    }
    if (bh <= (int)uVar6) {
      uVar2 = uVar6 & 0xffffffff;
    }
    for (; uVar6 != uVar2; uVar2 = uVar2 - 1) {
      *pauVar11 = auVar24;
      pauVar11 = pauVar11 + 1;
    }
LAB_002e431a:
    for (lVar3 = 0; uVar5 * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
      *(undefined8 *)dst = *(undefined8 *)((long)local_438 + lVar3);
      dst = dst + stride;
    }
    return;
  }
  if (bw == 0x10) {
    iVar12 = bh + 0xf << (bVar4 & 0x1f);
    auVar24 = pshufb(ZEXT116(above[iVar12]),(undefined1  [16])0x0);
    uVar6 = 0;
    uVar5 = 0;
    if (0 < bh) {
      uVar5 = uVar2;
    }
    pauVar11 = (undefined1 (*) [16])local_438;
    auVar25 = pmovsxbw(in_XMM3,0x1010101010101010);
    auVar26 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
    uVar9 = dx;
    while( true ) {
      if (uVar5 == uVar6) goto LAB_002e434e;
      iVar10 = (int)uVar9 >> (6 - bVar4 & 0x1f);
      uVar7 = iVar12 - iVar10 >> (bVar4 & 0x1f);
      if ((int)uVar7 < 1) break;
      if (0xf < uVar7) {
        uVar7 = 0x10;
      }
      auVar14 = *(undefined1 (*) [16])(above + iVar10);
      if (upsample_above == 0) {
        auVar27 = *(undefined1 (*) [16])(above + (long)iVar10 + 1);
        auVar28 = ZEXT416(uVar9 >> 1 & 0x1f);
        auVar28 = pshuflw(auVar28,auVar28,0);
        auVar34._0_4_ = auVar28._0_4_;
        auVar34._4_4_ = auVar34._0_4_;
        auVar34._8_4_ = auVar34._0_4_;
        auVar34._12_4_ = auVar34._0_4_;
      }
      else {
        auVar14 = pshufb(auVar14,_DAT_00468b70);
        auVar27 = auVar14 >> 0x40;
        auVar28 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
        auVar32._0_4_ = auVar28._0_4_;
        auVar32._4_4_ = auVar32._0_4_;
        auVar32._8_4_ = auVar32._0_4_;
        auVar32._12_4_ = auVar32._0_4_;
        auVar28 = psllw(auVar32,ZEXT416((uint)upsample_above));
        auVar33._0_2_ = auVar28._0_2_ >> 1;
        auVar33._2_2_ = auVar28._2_2_ >> 1;
        auVar33._4_2_ = auVar28._4_2_ >> 1;
        auVar33._6_2_ = auVar28._6_2_ >> 1;
        auVar33._8_2_ = auVar28._8_2_ >> 1;
        auVar33._10_2_ = auVar28._10_2_ >> 1;
        auVar33._12_2_ = auVar28._12_2_ >> 1;
        auVar33._14_2_ = auVar28._14_2_ >> 1;
        auVar34 = auVar33 & auVar26;
      }
      auVar28 = pmovzxbw(in_XMM9,auVar14);
      auVar44 = pmovzxbw(in_XMM10,auVar27);
      auVar36 = psllw(auVar28,5);
      in_XMM10._0_2_ = (auVar44._0_2_ - auVar28._0_2_) * auVar34._0_2_;
      in_XMM10._2_2_ = (auVar44._2_2_ - auVar28._2_2_) * auVar34._2_2_;
      in_XMM10._4_2_ = (auVar44._4_2_ - auVar28._4_2_) * auVar34._4_2_;
      in_XMM10._6_2_ = (auVar44._6_2_ - auVar28._6_2_) * auVar34._6_2_;
      in_XMM10._8_2_ = (auVar44._8_2_ - auVar28._8_2_) * auVar34._8_2_;
      in_XMM10._10_2_ = (auVar44._10_2_ - auVar28._10_2_) * auVar34._10_2_;
      in_XMM10._12_2_ = (auVar44._12_2_ - auVar28._12_2_) * auVar34._12_2_;
      in_XMM10._14_2_ = (auVar44._14_2_ - auVar28._14_2_) * auVar34._14_2_;
      uVar35 = (ushort)(auVar36._0_2_ + auVar25._0_2_ + in_XMM10._0_2_) >> 5;
      uVar37 = (ushort)(auVar36._2_2_ + auVar25._2_2_ + in_XMM10._2_2_) >> 5;
      uVar38 = (ushort)(auVar36._4_2_ + auVar25._4_2_ + in_XMM10._4_2_) >> 5;
      uVar39 = (ushort)(auVar36._6_2_ + auVar25._6_2_ + in_XMM10._6_2_) >> 5;
      uVar40 = (ushort)(auVar36._8_2_ + auVar25._8_2_ + in_XMM10._8_2_) >> 5;
      uVar41 = (ushort)(auVar36._10_2_ + auVar25._10_2_ + in_XMM10._10_2_) >> 5;
      uVar42 = (ushort)(auVar36._12_2_ + auVar25._12_2_ + in_XMM10._12_2_) >> 5;
      uVar43 = (ushort)(auVar36._14_2_ + auVar25._14_2_ + in_XMM10._14_2_) >> 5;
      auVar16._0_2_ = CONCAT11(0,auVar14[8]);
      auVar16[2] = auVar14[9];
      auVar16[3] = 0;
      auVar16[4] = auVar14[10];
      auVar16[5] = 0;
      auVar16[6] = auVar14[0xb];
      auVar16[7] = 0;
      auVar16[8] = auVar14[0xc];
      auVar16[9] = 0;
      auVar16[10] = auVar14[0xd];
      auVar16[0xb] = 0;
      auVar16[0xc] = auVar14[0xe];
      auVar16[0xd] = 0;
      auVar16[0xe] = auVar14[0xf];
      auVar16[0xf] = 0;
      auVar28 = psllw(auVar16,5);
      uVar13 = (ushort)(auVar28._0_2_ + auVar25._0_2_ + (auVar27[8] - auVar16._0_2_) * auVar34._0_2_
                       ) >> 5;
      uVar17 = (ushort)(auVar28._2_2_ + auVar25._2_2_ +
                       ((ushort)auVar27[9] - (ushort)auVar14[9]) * auVar34._2_2_) >> 5;
      uVar18 = (ushort)(auVar28._4_2_ + auVar25._4_2_ +
                       ((ushort)auVar27[10] - (ushort)auVar14[10]) * auVar34._4_2_) >> 5;
      uVar19 = (ushort)(auVar28._6_2_ + auVar25._6_2_ +
                       ((ushort)auVar27[0xb] - (ushort)auVar14[0xb]) * auVar34._6_2_) >> 5;
      uVar20 = (ushort)(auVar28._8_2_ + auVar25._8_2_ +
                       ((ushort)auVar27[0xc] - (ushort)auVar14[0xc]) * auVar34._8_2_) >> 5;
      uVar21 = (ushort)(auVar28._10_2_ + auVar25._10_2_ +
                       ((ushort)auVar27[0xd] - (ushort)auVar14[0xd]) * auVar34._10_2_) >> 5;
      uVar22 = (ushort)(auVar28._12_2_ + auVar25._12_2_ +
                       ((ushort)auVar27[0xe] - (ushort)auVar14[0xe]) * auVar34._12_2_) >> 5;
      uVar23 = (ushort)(auVar28._14_2_ + auVar25._14_2_ +
                       ((ushort)auVar27[0xf] - (ushort)auVar14[0xf]) * auVar34._14_2_) >> 5;
      in_XMM9[1] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
      in_XMM9[0] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
      in_XMM9[2] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
      in_XMM9[3] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
      in_XMM9[4] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
      in_XMM9[5] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
      in_XMM9[6] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
      in_XMM9[7] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
      in_XMM9[8] = (uVar13 != 0) * (uVar13 < 0x100) * (char)uVar13 - (0xff < uVar13);
      in_XMM9[9] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
      in_XMM9[10] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
      in_XMM9[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
      in_XMM9[0xc] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
      in_XMM9[0xd] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
      in_XMM9[0xe] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
      in_XMM9[0xf] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
      auVar14 = pblendvb(auVar24,in_XMM9,(undefined1  [16])Mask[0][uVar7]);
      *pauVar11 = auVar14;
      uVar9 = uVar9 + dx;
      uVar6 = uVar6 + 1;
      pauVar11 = pauVar11 + 1;
    }
    if (bh <= (int)uVar6) {
      uVar2 = uVar6 & 0xffffffff;
    }
    for (; uVar6 != uVar2; uVar2 = uVar2 - 1) {
      *pauVar11 = auVar24;
      pauVar11 = pauVar11 + 1;
    }
LAB_002e434e:
    for (lVar3 = 0; uVar5 * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
      uVar1 = *(undefined8 *)((long)local_438 + lVar3 + 8);
      *(undefined8 *)dst = *(undefined8 *)((long)local_438 + lVar3);
      *(undefined8 *)(dst + 8) = uVar1;
      dst = dst + stride;
    }
    return;
  }
  if (bw == 0x20) {
    dr_prediction_z1_32xN_sse4_1(bh,dst,stride,above,dx,(int)left);
    return;
  }
  if (bw != 4) {
    return;
  }
  iVar12 = bh + 3 << (bVar4 & 0x1f);
  auVar24 = pshufb(ZEXT116(above[iVar12]),(undefined1  [16])0x0);
  uVar6 = 0;
  uVar5 = 0;
  if (0 < bh) {
    uVar5 = (ulong)(uint)bh;
  }
  pauVar11 = (undefined1 (*) [16])local_438;
  auVar25 = pmovsxbw(in_XMM3,0x1010101010101010);
  auVar26 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
  uVar9 = dx;
  while( true ) {
    if (uVar5 == uVar6) goto LAB_002e4382;
    iVar10 = (int)uVar9 >> (6 - bVar4 & 0x1f);
    uVar7 = iVar12 - iVar10 >> (bVar4 & 0x1f);
    if ((int)uVar7 < 1) break;
    uVar8 = (ulong)uVar7;
    if (3 < uVar7) {
      uVar8 = 4;
    }
    auVar14 = *(undefined1 (*) [16])(above + iVar10);
    if (upsample_above == 0) {
      auVar27 = *(undefined1 (*) [16])(above + (long)iVar10 + 1);
      auVar28 = ZEXT416(uVar9 >> 1 & 0x1f);
      auVar28 = pshuflw(auVar28,auVar28,0);
      auVar31._0_4_ = auVar28._0_4_;
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
    }
    else {
      auVar14 = pshufb(auVar14,_DAT_00468b70);
      auVar27 = auVar14 >> 0x40;
      auVar28 = pshuflw(ZEXT416(uVar9),ZEXT416(uVar9),0);
      auVar29._0_4_ = auVar28._0_4_;
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_4_ = auVar29._0_4_;
      auVar29._12_4_ = auVar29._0_4_;
      auVar28 = psllw(auVar29,ZEXT416((uint)upsample_above));
      auVar30._0_2_ = auVar28._0_2_ >> 1;
      auVar30._2_2_ = auVar28._2_2_ >> 1;
      auVar30._4_2_ = auVar28._4_2_ >> 1;
      auVar30._6_2_ = auVar28._6_2_ >> 1;
      auVar30._8_2_ = auVar28._8_2_ >> 1;
      auVar30._10_2_ = auVar28._10_2_ >> 1;
      auVar30._12_2_ = auVar28._12_2_ >> 1;
      auVar30._14_2_ = auVar28._14_2_ >> 1;
      auVar31 = auVar30 & auVar26;
    }
    auVar28 = pmovzxbw(in_XMM9,auVar14);
    auVar44 = pmovzxbw(in_XMM10,auVar27);
    auVar36 = psllw(auVar28,5);
    in_XMM10._0_2_ = (auVar44._0_2_ - auVar28._0_2_) * auVar31._0_2_;
    in_XMM10._2_2_ = (auVar44._2_2_ - auVar28._2_2_) * auVar31._2_2_;
    in_XMM10._4_2_ = (auVar44._4_2_ - auVar28._4_2_) * auVar31._4_2_;
    in_XMM10._6_2_ = (auVar44._6_2_ - auVar28._6_2_) * auVar31._6_2_;
    in_XMM10._8_2_ = (auVar44._8_2_ - auVar28._8_2_) * auVar31._8_2_;
    in_XMM10._10_2_ = (auVar44._10_2_ - auVar28._10_2_) * auVar31._10_2_;
    in_XMM10._12_2_ = (auVar44._12_2_ - auVar28._12_2_) * auVar31._12_2_;
    in_XMM10._14_2_ = (auVar44._14_2_ - auVar28._14_2_) * auVar31._14_2_;
    uVar35 = (ushort)(auVar36._0_2_ + auVar25._0_2_ + in_XMM10._0_2_) >> 5;
    uVar37 = (ushort)(auVar36._2_2_ + auVar25._2_2_ + in_XMM10._2_2_) >> 5;
    uVar38 = (ushort)(auVar36._4_2_ + auVar25._4_2_ + in_XMM10._4_2_) >> 5;
    uVar39 = (ushort)(auVar36._6_2_ + auVar25._6_2_ + in_XMM10._6_2_) >> 5;
    uVar40 = (ushort)(auVar36._8_2_ + auVar25._8_2_ + in_XMM10._8_2_) >> 5;
    uVar41 = (ushort)(auVar36._10_2_ + auVar25._10_2_ + in_XMM10._10_2_) >> 5;
    uVar42 = (ushort)(auVar36._12_2_ + auVar25._12_2_ + in_XMM10._12_2_) >> 5;
    uVar43 = (ushort)(auVar36._14_2_ + auVar25._14_2_ + in_XMM10._14_2_) >> 5;
    auVar15._0_2_ = CONCAT11(0,auVar14[8]);
    auVar15[2] = auVar14[9];
    auVar15[3] = 0;
    auVar15[4] = auVar14[10];
    auVar15[5] = 0;
    auVar15[6] = auVar14[0xb];
    auVar15[7] = 0;
    auVar15[8] = auVar14[0xc];
    auVar15[9] = 0;
    auVar15[10] = auVar14[0xd];
    auVar15[0xb] = 0;
    auVar15[0xc] = auVar14[0xe];
    auVar15[0xd] = 0;
    auVar15[0xe] = auVar14[0xf];
    auVar15[0xf] = 0;
    auVar28 = psllw(auVar15,5);
    uVar13 = (ushort)(auVar28._0_2_ + auVar25._0_2_ + (auVar27[8] - auVar15._0_2_) * auVar31._0_2_)
             >> 5;
    uVar17 = (ushort)(auVar28._2_2_ + auVar25._2_2_ +
                     ((ushort)auVar27[9] - (ushort)auVar14[9]) * auVar31._2_2_) >> 5;
    uVar18 = (ushort)(auVar28._4_2_ + auVar25._4_2_ +
                     ((ushort)auVar27[10] - (ushort)auVar14[10]) * auVar31._4_2_) >> 5;
    uVar19 = (ushort)(auVar28._6_2_ + auVar25._6_2_ +
                     ((ushort)auVar27[0xb] - (ushort)auVar14[0xb]) * auVar31._6_2_) >> 5;
    uVar20 = (ushort)(auVar28._8_2_ + auVar25._8_2_ +
                     ((ushort)auVar27[0xc] - (ushort)auVar14[0xc]) * auVar31._8_2_) >> 5;
    uVar21 = (ushort)(auVar28._10_2_ + auVar25._10_2_ +
                     ((ushort)auVar27[0xd] - (ushort)auVar14[0xd]) * auVar31._10_2_) >> 5;
    uVar22 = (ushort)(auVar28._12_2_ + auVar25._12_2_ +
                     ((ushort)auVar27[0xe] - (ushort)auVar14[0xe]) * auVar31._12_2_) >> 5;
    uVar23 = (ushort)(auVar28._14_2_ + auVar25._14_2_ +
                     ((ushort)auVar27[0xf] - (ushort)auVar14[0xf]) * auVar31._14_2_) >> 5;
    in_XMM9[1] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
    in_XMM9[0] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
    in_XMM9[2] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
    in_XMM9[3] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    in_XMM9[4] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
    in_XMM9[5] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
    in_XMM9[6] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
    in_XMM9[7] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
    in_XMM9[8] = (uVar13 != 0) * (uVar13 < 0x100) * (char)uVar13 - (0xff < uVar13);
    in_XMM9[9] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
    in_XMM9[10] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
    in_XMM9[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
    in_XMM9[0xc] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
    in_XMM9[0xd] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
    in_XMM9[0xe] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
    in_XMM9[0xf] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
    auVar14 = pblendvb(auVar24,in_XMM9,(undefined1  [16])Mask[0][uVar8]);
    *pauVar11 = auVar14;
    uVar9 = uVar9 + dx;
    uVar6 = uVar6 + 1;
    pauVar11 = pauVar11 + 1;
  }
  if (bh <= (int)uVar6) {
    uVar2 = uVar6 & 0xffffffff;
  }
  for (; uVar6 != uVar2; uVar2 = uVar2 - 1) {
    *pauVar11 = auVar24;
    pauVar11 = pauVar11 + 1;
  }
LAB_002e4382:
  for (lVar3 = 0; uVar5 * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
    *(undefined4 *)dst = *(undefined4 *)((long)local_438 + lVar3);
    dst = dst + stride;
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_above, int dx, int dy) {
  (void)left;
  (void)dy;
  switch (bw) {
    case 4:
      dr_prediction_z1_4xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 8:
      dr_prediction_z1_8xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 16:
      dr_prediction_z1_16xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 32:
      dr_prediction_z1_32xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 64:
      dr_prediction_z1_64xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    default: assert(0 && "Invalid block size");
  }
  return;
}